

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

bool icu_63::number::impl::blueprint_helpers::parseExponentSignOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *param_3)

{
  char16_t cVar1;
  int32_t sLength;
  UStringTrieResult UVar2;
  char16_t *pcVar3;
  bool bVar4;
  uint uVar5;
  Notation NVar6;
  UCharsTrie tempStemTrie;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UCharsTrie local_78;
  UnicodeString local_58;
  
  local_78.ownedArray_ = (char16_t *)0x0;
  local_78.uchars_ = ::(anonymous_namespace)::kSerializedStemTrie;
  local_78.pos_ = ::(anonymous_namespace)::kSerializedStemTrie;
  local_78.remainingMatchLength_ = -1;
  local_80 = ::(anonymous_namespace)::kSerializedStemTrie;
  numparse::impl::StringSegment::toTempUnicodeString(&local_58,segment);
  if ((local_58.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_58.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_58.fUnion.fFields.fArray = (char16_t *)((long)&local_58.fUnion + 2);
    }
  }
  else {
    local_58.fUnion.fFields.fArray = (char16_t *)0x0;
  }
  local_98.p_ = local_58.fUnion.fFields.fArray;
  sLength = numparse::impl::StringSegment::length(segment);
  UVar2 = UCharsTrie::next(&local_78,&local_98,sLength);
  local_90 = local_98.p_;
  UnicodeString::~UnicodeString(&local_58);
  if (0xfffffffd < UVar2 + ~USTRINGTRIE_INTERMEDIATE_VALUE) {
    pcVar3 = local_78.pos_ + 1;
    cVar1 = *local_78.pos_;
    if (cVar1 < L'\0') {
      uVar5 = (ushort)cVar1 & 0x7fff;
      if (0x3fff < uVar5) {
        if (uVar5 == 0x7fff) {
          uVar5 = (uint)(ushort)local_78.pos_[1] << 0x10;
          pcVar3 = local_78.pos_ + 2;
        }
        else {
          uVar5 = uVar5 * 0x10000 + 0xc0000000;
        }
        uVar5 = (ushort)*pcVar3 | uVar5;
      }
    }
    else if ((ushort)cVar1 < 0x4040) {
      uVar5 = ((ushort)cVar1 >> 6) - 1;
    }
    else if ((ushort)cVar1 < 0x7fc0) {
      uVar5 = ((ushort)cVar1 & 0x7fc0) * 0x400 + (uint)(ushort)*pcVar3 + 0xfeff0000;
    }
    else {
      uVar5 = CONCAT22(local_78.pos_[1],local_78.pos_[2]);
    }
    if (uVar5 - 0x1f < UNUM_SIGN_COUNT) {
      NVar6 = (Notation)
              ScientificNotation::withExponentSignDisplay
                        ((ScientificNotation *)&macros->notation,uVar5 - 0x1f);
      macros->notation = NVar6;
      bVar4 = true;
      goto LAB_002645d9;
    }
  }
  bVar4 = false;
LAB_002645d9:
  UCharsTrie::~UCharsTrie(&local_78);
  return bVar4;
}

Assistant:

bool
blueprint_helpers::parseExponentSignOption(const StringSegment& segment, MacroProps& macros, UErrorCode&) {
    // Get the sign display type out of the CharsTrie data structure.
    UCharsTrie tempStemTrie(kSerializedStemTrie);
    UStringTrieResult result = tempStemTrie.next(
            segment.toTempUnicodeString().getBuffer(),
            segment.length());
    if (result != USTRINGTRIE_INTERMEDIATE_VALUE && result != USTRINGTRIE_FINAL_VALUE) {
        return false;
    }
    auto sign = stem_to_object::signDisplay(static_cast<StemEnum>(tempStemTrie.getValue()));
    if (sign == UNUM_SIGN_COUNT) {
        return false;
    }
    macros.notation = static_cast<ScientificNotation&>(macros.notation).withExponentSignDisplay(sign);
    return true;
}